

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O1

void adt_list_destroy(adt_list_t *self)

{
  adt_list_elem_tag *paVar1;
  adt_list_elem_t *__ptr;
  _func_void_void_ptr *p_Var2;
  
  if ((self != (adt_list_t *)0x0) && (__ptr = self->pFirst, __ptr != (adt_list_elem_t *)0x0)) {
    if (self->destructorEnable == true) {
      p_Var2 = self->pDestructor;
    }
    else {
      p_Var2 = (_func_void_void_ptr *)0x0;
    }
    do {
      paVar1 = __ptr->pNext;
      if (p_Var2 != (_func_void_void_ptr *)0x0) {
        (*p_Var2)(__ptr->pItem);
      }
      free(__ptr);
      __ptr = paVar1;
    } while (paVar1 != (adt_list_elem_tag *)0x0);
  }
  return;
}

Assistant:

void  adt_list_destroy(adt_list_t *self)
{
   if (self != 0)
   {
      adt_list_elem_t *iter = self->pFirst;
      void (*destructor)(void*) = (void (*)(void*)) 0;
      if (iter == 0)
      {
         return; //empty list
      }
      if ( (self->destructorEnable != false) && (self->pDestructor != 0) )
      {
         destructor = self->pDestructor;
      }
      while( iter != 0 )
      {
         adt_list_elem_t *pNext = iter->pNext;
         if (destructor != 0)
         {
            destructor(iter->pItem);
         }
         adt_list_elem_delete(iter);
         iter=pNext;
      }
   }
}